

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v9::detail::write<char,fmt::v9::appender>
                   (appender out,char *s,basic_format_specs<char> *specs,locale_ref param_4)

{
  presentation_type pVar1;
  size_t sVar2;
  appender aVar3;
  basic_string_view<char> s_00;
  
  pVar1 = specs->type;
  if (pVar1 < pointer) {
    if ((pVar1 == none) || (pVar1 == string)) {
LAB_0011a766:
      sVar2 = strlen(s);
      s_00.size_ = sVar2;
      s_00.data_ = s;
      aVar3 = write<char,fmt::v9::appender>(out,s_00,specs,(locale_ref)0x0);
      return (appender)aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
  }
  else {
    if (pVar1 == pointer) {
      aVar3 = write_ptr<char,fmt::v9::appender,unsigned_long>(out,(unsigned_long)s,specs);
      return (appender)aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    if (pVar1 == debug) goto LAB_0011a766;
  }
  throw_format_error("invalid type specifier");
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s,
                         const basic_format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  return check_cstring_type_spec(specs.type)
             ? write(out, basic_string_view<Char>(s), specs, {})
             : write_ptr<Char>(out, bit_cast<uintptr_t>(s), &specs);
}